

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O2

NFSubstitution * __thiscall
icu_63::NFRule::extractSubstitution
          (NFRule *this,NFRuleSet *ruleSet,NFRule *predecessor,UErrorCode *status)

{
  UnicodeString *this_00;
  short sVar1;
  char16_t cVar2;
  int32_t offset;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  NFSubstitution *pNVar6;
  UnicodeString subToken;
  
  offset = indexOfAnyRulePrefix(this);
  if (offset == -1) {
LAB_0025306b:
    pNVar6 = (NFSubstitution *)0x0;
  }
  else {
    this_00 = &this->fRuleText;
    iVar3 = UnicodeString::indexOf(this_00,L">>>",3,0);
    if (iVar3 == offset) {
      iVar4 = offset + 2;
LAB_00252fff:
      if (iVar4 == -1) goto LAB_0025306b;
    }
    else {
      cVar2 = UnicodeString::doCharAt(this_00,offset);
      iVar4 = UnicodeString::indexOf(this_00,cVar2,offset + 1);
      if (iVar4 == -1 || cVar2 != L'<') goto LAB_00252fff;
      sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar5 = (this->fRuleText).fUnion.fFields.fLength;
      }
      else {
        iVar5 = (int)sVar1 >> 5;
      }
      if (iVar4 < iVar5 + -1) {
        cVar2 = UnicodeString::doCharAt(this_00,iVar4 + 1);
        if (cVar2 == L'<') {
          iVar4 = iVar4 + 1;
        }
        goto LAB_00252fff;
      }
    }
    subToken.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003daac8;
    subToken.fUnion.fStackFields.fLengthAndFlags = 2;
    UnicodeString::setTo(&subToken,this_00,offset,(iVar4 + 1) - offset);
    pNVar6 = NFSubstitution::makeSubstitution
                       (offset,this,predecessor,ruleSet,this->formatter,&subToken,status);
    UnicodeString::removeBetween(this_00,offset,iVar4 + 1);
    UnicodeString::~UnicodeString(&subToken);
  }
  return pNVar6;
}

Assistant:

NFSubstitution *
NFRule::extractSubstitution(const NFRuleSet* ruleSet,
                            const NFRule* predecessor,
                            UErrorCode& status)
{
    NFSubstitution* result = NULL;

    // search the rule's rule text for the first two characters of
    // a substitution token
    int32_t subStart = indexOfAnyRulePrefix();
    int32_t subEnd = subStart;

    // if we didn't find one, create a null substitution positioned
    // at the end of the rule text
    if (subStart == -1) {
        return NULL;
    }

    // special-case the ">>>" token, since searching for the > at the
    // end will actually find the > in the middle
    if (fRuleText.indexOf(gGreaterGreaterGreater, 3, 0) == subStart) {
        subEnd = subStart + 2;

        // otherwise the substitution token ends with the same character
        // it began with
    } else {
        UChar c = fRuleText.charAt(subStart);
        subEnd = fRuleText.indexOf(c, subStart + 1);
        // special case for '<%foo<<'
        if (c == gLessThan && subEnd != -1 && subEnd < fRuleText.length() - 1 && fRuleText.charAt(subEnd+1) == c) {
            // ordinals use "=#,##0==%abbrev=" as their rule.  Notice that the '==' in the middle
            // occurs because of the juxtaposition of two different rules.  The check for '<' is a hack
            // to get around this.  Having the duplicate at the front would cause problems with
            // rules like "<<%" to format, say, percents...
            ++subEnd;
        }
   }

    // if we don't find the end of the token (i.e., if we're on a single,
    // unmatched token character), create a null substitution positioned
    // at the end of the rule
    if (subEnd == -1) {
        return NULL;
    }

    // if we get here, we have a real substitution token (or at least
    // some text bounded by substitution token characters).  Use
    // makeSubstitution() to create the right kind of substitution
    UnicodeString subToken;
    subToken.setTo(fRuleText, subStart, subEnd + 1 - subStart);
    result = NFSubstitution::makeSubstitution(subStart, this, predecessor, ruleSet,
        this->formatter, subToken, status);

    // remove the substitution from the rule text
    fRuleText.removeBetween(subStart, subEnd+1);

    return result;
}